

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostic.cpp
# Opt level: O0

spv_result_t spvDiagnosticPrint(spv_diagnostic diagnostic)

{
  ostream *poVar1;
  spv_diagnostic diagnostic_local;
  
  if (diagnostic == (spv_diagnostic)0x0) {
    diagnostic_local._4_4_ = SPV_ERROR_INVALID_DIAGNOSTIC;
  }
  else if ((diagnostic->isTextSource & 1U) == 0) {
    std::operator<<((ostream *)&std::cerr,"error: ");
    if ((diagnostic->position).index != 0) {
      poVar1 = (ostream *)std::ostream::operator<<(&std::cerr,(diagnostic->position).index);
      std::operator<<(poVar1,": ");
    }
    poVar1 = std::operator<<((ostream *)&std::cerr,diagnostic->error);
    std::operator<<(poVar1,"\n");
    diagnostic_local._4_4_ = SPV_SUCCESS;
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"error: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(diagnostic->position).line + 1);
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(diagnostic->position).column + 1);
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,diagnostic->error);
    std::operator<<(poVar1,"\n");
    diagnostic_local._4_4_ = SPV_SUCCESS;
  }
  return diagnostic_local._4_4_;
}

Assistant:

spv_result_t spvDiagnosticPrint(const spv_diagnostic diagnostic) {
  if (!diagnostic) return SPV_ERROR_INVALID_DIAGNOSTIC;

  if (diagnostic->isTextSource) {
    // NOTE: This is a text position
    // NOTE: add 1 to the line as editors start at line 1, we are counting new
    // line characters to start at line 0
    std::cerr << "error: " << diagnostic->position.line + 1 << ": "
              << diagnostic->position.column + 1 << ": " << diagnostic->error
              << "\n";
    return SPV_SUCCESS;
  }

  // NOTE: Assume this is a binary position
  std::cerr << "error: ";
  if (diagnostic->position.index > 0)
    std::cerr << diagnostic->position.index << ": ";
  std::cerr << diagnostic->error << "\n";
  return SPV_SUCCESS;
}